

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDateTime QDateTime::fromString(QString *string,QStringView format,int baseYear,QCalendar cal)

{
  long lVar1;
  bool bVar2;
  Data DVar3;
  undefined4 in_register_0000000c;
  void *pvVar4;
  QCalendar in_R9;
  long in_FS_OFFSET;
  QStringView newFormat;
  QLocale local_e0;
  QDateTimeParser dt;
  QDateTime datetime;
  
  newFormat.m_data._4_4_ = in_register_0000000c;
  newFormat.m_data._0_4_ = baseYear;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  datetime.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime(&datetime);
  memset(&dt,0xaa,0x98);
  pvVar4 = (void *)0x10;
  QDateTimeParser::QDateTimeParser(&dt,QDateTime,FromString,in_R9);
  QLocale::c(&local_e0,pvVar4);
  QLocale::operator=(&dt.defaultLocale,&local_e0);
  QLocale::~QLocale(&local_e0);
  newFormat.m_size = (qsizetype)format.m_data;
  bVar2 = QDateTimeParser::parseFormat(&dt,newFormat);
  if (bVar2) {
    bVar2 = QDateTimeParser::fromString(&dt,(QString *)format.m_size,&datetime,(int)cal.d_ptr);
    if (!bVar2) {
      DVar3 = datetime.d;
      if (((ulong)datetime.d & 1) == 0) {
        DVar3._4_4_ = 0;
        DVar3._0_4_ = *(uint *)((long)datetime.d + 4);
      }
      if (((ulong)DVar3.d & 8) != 0) goto LAB_003115f6;
    }
    QDateTime((QDateTime *)string,&datetime);
  }
  else {
LAB_003115f6:
    QDateTime((QDateTime *)string);
  }
  QDateTimeParser::~QDateTimeParser(&dt);
  ~QDateTime(&datetime);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDateTime)(Data)string;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTime::fromString(const QString &string, QStringView format, int baseYear,
                                QCalendar cal)
{
#if QT_CONFIG(datetimeparser)
    QDateTime datetime;

    QDateTimeParser dt(QMetaType::QDateTime, QDateTimeParser::FromString, cal);
    dt.setDefaultLocale(QLocale::c());
    if (dt.parseFormat(format) && (dt.fromString(string, &datetime, baseYear)
                                   || !datetime.isValid())) {
        return datetime;
    }
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
    Q_UNUSED(baseYear);
    Q_UNUSED(cal);
#endif
    return QDateTime();
}